

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O0

bool __thiscall
NumberTemp::IsTempIndirTransferLoad(NumberTemp *this,Instr *instr,BackwardPass *backwardPass)

{
  code *pcVar1;
  bool bVar2;
  IndirOpnd *this_00;
  Opnd *pOVar3;
  undefined4 *puVar4;
  byte local_3c;
  byte local_3b;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3a;
  RegOpnd *local_38;
  RegOpnd *indexOpnd;
  Opnd *src1Opnd;
  BackwardPass *backwardPass_local;
  Instr *instr_local;
  NumberTemp *this_local;
  
  src1Opnd = (Opnd *)backwardPass;
  backwardPass_local = (BackwardPass *)instr;
  instr_local = (Instr *)this;
  bVar2 = DoMarkTempNumbersOnTempObjects(this,backwardPass);
  if (bVar2) {
    if (*(short *)&backwardPass_local->currentRegion == 0x97) {
      indexOpnd = (RegOpnd *)IR::Instr::GetSrc1((Instr *)backwardPass_local);
      this_00 = IR::Opnd::AsIndirOpnd((Opnd *)indexOpnd);
      local_38 = IR::IndirOpnd::GetIndexOpnd(this_00);
      local_3b = 0;
      if (local_38 != (RegOpnd *)0x0) {
        local_3c = 1;
        if ((*(uint *)&local_38->m_sym->field_0x18 >> 1 & 1) == 0) {
          local_3a.field_0 =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               IR::Opnd::GetValueType(&local_38->super_Opnd);
          bVar2 = ValueType::IsInt((ValueType *)&local_3a.field_0);
          local_3c = bVar2 ^ 0xff;
        }
        local_3b = local_3c;
      }
      if ((local_3b & 1) != 0) {
        bVar2 = IR::Opnd::CanStoreTemp(&indexOpnd->super_Opnd);
        return bVar2;
      }
    }
    else {
      pOVar3 = IR::Instr::GetSrc1((Instr *)backwardPass_local);
      if (pOVar3 != (Opnd *)0x0) {
        pOVar3 = IR::Instr::GetSrc1((Instr *)backwardPass_local);
        bVar2 = IR::Opnd::IsSymOpnd(pOVar3);
        if (!bVar2) {
          pOVar3 = IR::Instr::GetSrc1((Instr *)backwardPass_local);
          bVar2 = IR::Opnd::CanStoreTemp(pOVar3);
          if (bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                               ,0x2fd,
                               "(instr->GetSrc1() == nullptr || instr->GetSrc1()->IsSymOpnd() || !instr->GetSrc1()->CanStoreTemp())"
                               ,
                               "instr->GetSrc1() == nullptr || instr->GetSrc1()->IsSymOpnd() || !instr->GetSrc1()->CanStoreTemp()"
                              );
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 0;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool
NumberTemp::IsTempIndirTransferLoad(IR::Instr * instr, BackwardPass * backwardPass)
{
    if (DoMarkTempNumbersOnTempObjects(backwardPass))
    {
        if (instr->m_opcode == Js::OpCode::LdElemI_A)
        {
            // If the index is an int, then we don't care about the non-temp use
            IR::Opnd * src1Opnd = instr->GetSrc1();
            IR::RegOpnd * indexOpnd = src1Opnd->AsIndirOpnd()->GetIndexOpnd();
            if (indexOpnd && (indexOpnd->m_sym->m_isNotNumber || !indexOpnd->GetValueType().IsInt()))
            {
                return src1Opnd->CanStoreTemp();
            }
        }
        else
        {
            // All other opcode shouldn't have sym opnd that can store temp, See ObjectTemp::IsTempUseOpCodeSym.
            Assert(instr->GetSrc1() == nullptr || instr->GetSrc1()->IsSymOpnd()
                || !instr->GetSrc1()->CanStoreTemp());
        }
    }
    return false;
}